

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scanner.c
# Opt level: O3

_Bool tree_sitter_gdscript_external_scanner_scan(void *payload,TSLexer *lexer,_Bool *valid_symbols)

{
  byte bVar1;
  ushort uVar2;
  _Bool _Var3;
  TSSymbol TVar4;
  int iVar5;
  uint uVar6;
  void *pvVar7;
  byte bVar8;
  uint *puVar9;
  uint uVar10;
  byte bVar11;
  size_t __size;
  bool bVar12;
  uint uVar13;
  
  if (valid_symbols[4] == true) {
    bVar11 = valid_symbols[1];
  }
  else {
    bVar11 = 0;
  }
  bVar8 = 1;
  if ((valid_symbols[9] == false) && (valid_symbols[7] == false)) {
    bVar8 = valid_symbols[8];
  }
  if (valid_symbols[4] != false) {
    iVar5 = **(int **)((long)payload + 8);
    if (iVar5 != 0 && (bVar11 & 1) == 0) {
      bVar1 = *(byte *)(*(long *)(*(int **)((long)payload + 8) + 2) + (ulong)(iVar5 - 1));
      uVar13 = (int)((uint)bVar1 << 0x1d) >> 0x1f & 0x60;
      uVar6 = 0x22;
      if ((bVar1 & 3) == 1) {
        uVar6 = uVar13;
      }
      uVar10 = (bVar1 & 1) * 5 + 0x22;
      if ((bVar1 & 3) == 0) {
        uVar6 = uVar13;
        uVar10 = uVar13;
      }
      uVar13 = 0x27;
      if ((bVar1 & 1) == 0) {
        uVar13 = uVar6;
      }
      _Var3 = false;
      do {
        while (uVar6 = lexer->lookahead, uVar6 == 0x5c) {
          if ((bVar1 & 8) == 0) {
            (*lexer->mark_end)(lexer);
            if ((bVar1 & 0x40) == 0) {
LAB_001047c9:
              lexer->result_symbol = 4;
              return _Var3;
            }
            (*lexer->advance)(lexer,false);
            uVar6 = lexer->lookahead - 0x4e;
            if ((0x27 < uVar6) || ((0x8000000081U >> ((ulong)uVar6 & 0x3f) & 1) == 0))
            goto LAB_001047c9;
            (*lexer->advance)(lexer,false);
            goto LAB_00104503;
          }
          (*lexer->advance)(lexer,false);
          if ((lexer->lookahead == 0x5c) || (lexer->lookahead == uVar13)) {
            (*lexer->advance)(lexer,false);
          }
        }
        if (uVar6 == 0) break;
        if (((uVar6 == 0x7d) || (uVar6 == 0x7b)) && ((bVar1 & 0x10) != 0)) {
          (*lexer->mark_end)(lexer);
          goto LAB_001047c9;
        }
        if (uVar6 == uVar10) {
          if ((bVar1 & 0x20) == 0) {
            TVar4 = 4;
            if (_Var3 == false) {
              (*lexer->advance)(lexer,false);
              **(int **)((long)payload + 8) = **(int **)((long)payload + 8) + -1;
              TVar4 = 5;
            }
            lexer->result_symbol = TVar4;
            (*lexer->mark_end)(lexer);
            return true;
          }
          (*lexer->mark_end)(lexer);
          (*lexer->advance)(lexer,false);
          if ((lexer->lookahead == uVar10) &&
             ((*lexer->advance)(lexer,false), lexer->lookahead == uVar10)) {
            if (_Var3 == false) {
              (*lexer->advance)(lexer,false);
              (*lexer->mark_end)(lexer);
              **(int **)((long)payload + 8) = **(int **)((long)payload + 8) + -1;
              lexer->result_symbol = 5;
              return true;
            }
          }
          else {
            (*lexer->mark_end)(lexer);
          }
          lexer->result_symbol = 4;
          return true;
        }
        if ((!(bool)(~_Var3 & 1) && uVar6 == 10) && ((bVar1 & 0x20) == 0)) {
          return false;
        }
LAB_00104503:
        (*lexer->advance)(lexer,false);
        _Var3 = true;
      } while( true );
    }
  }
  (*lexer->mark_end)(lexer);
  uVar6 = 0xffffffff;
  bVar12 = false;
  uVar13 = 0;
  do {
    iVar5 = lexer->lookahead;
    if (iVar5 < 0x20) {
      if (1 < iVar5 - 0xcU) {
        if (iVar5 == 9) {
          uVar13 = uVar13 + 8;
          goto LAB_001042db;
        }
        if (iVar5 != 10) {
LAB_00104359:
          _Var3 = (*lexer->eof)(lexer);
          if (_Var3) {
            uVar13 = 0;
          }
          if (bVar12 || _Var3) {
            puVar9 = *payload;
            uVar10 = *puVar9;
            if (uVar10 != 0) {
              pvVar7 = *(void **)(puVar9 + 2);
              uVar2 = *(ushort *)((long)pvVar7 + (ulong)(uVar10 - 1) * 2);
              if ((valid_symbols[1] == true) && (uVar2 < uVar13)) {
                if (puVar9[1] == uVar10) {
                  __size = 0x20;
                  if (0xf < uVar10 * 2) {
                    __size = (ulong)(uVar10 * 2) * 2;
                  }
                  pvVar7 = realloc(pvVar7,__size);
                  if (pvVar7 == (void *)0x0) {
                    __assert_fail("tmp != NULL",
                                  "/workspace/llm4binary/github/license_c_cmakelists/PrestonKnopp[P]tree-sitter-gdscript/src/scanner.c"
                                  ,0x13b,
                                  "_Bool tree_sitter_gdscript_external_scanner_scan(void *, TSLexer *, const _Bool *)"
                                 );
                  }
                  puVar9 = *payload;
                  *(void **)(puVar9 + 2) = pvVar7;
                  uVar10 = *puVar9;
                  uVar6 = 0x10;
                  if (0x10 < uVar10 * 2) {
                    uVar6 = uVar10 * 2;
                  }
                  puVar9[1] = uVar6;
                }
                *puVar9 = uVar10 + 1;
                *(short *)((long)pvVar7 + (ulong)uVar10 * 2) = (short)uVar13;
                lexer->result_symbol = 1;
                return true;
              }
              if (((valid_symbols[2] != false) ||
                  ((*valid_symbols == false && (((bVar8 | valid_symbols[3]) & 1) == 0)))) &&
                 ((int)uVar6 < (int)(uint)uVar2 && uVar13 < uVar2)) {
                *puVar9 = uVar10 - 1;
                lexer->result_symbol = 2;
                return true;
              }
            }
            if (((~*valid_symbols | bVar11) & 1) == 0) {
              lexer->result_symbol = 0;
              return true;
            }
          }
          if (((((valid_symbols[10] == false) && (valid_symbols[7] == false)) &&
               (valid_symbols[9] == false)) && (valid_symbols[8] == false)) &&
             ((bVar11 != 0 || (valid_symbols[0xb] == true)))) {
            uVar13 = lexer->lookahead - 0x29;
            if (((uVar13 < 0x35) && ((0x10000000000009U >> ((ulong)uVar13 & 0x3f) & 1) != 0)) ||
               (lexer->lookahead == 0x7d)) {
              if (valid_symbols[2] == true) {
                iVar5 = **payload;
                if (iVar5 != 0) {
                  **payload = iVar5 + -1;
                }
              }
              lexer->result_symbol = 0xb;
              return true;
            }
          }
          if (uVar6 != 0xffffffff) {
            return false;
          }
          if (valid_symbols[3] != true) {
            return false;
          }
          bVar11 = 0;
          break;
        }
        bVar12 = true;
      }
LAB_001042d8:
      uVar13 = 0;
    }
    else if (iVar5 == 0x5c) {
      (*lexer->advance)(lexer,true);
      iVar5 = lexer->lookahead;
      if (iVar5 == 0xd) {
        (*lexer->advance)(lexer,true);
        iVar5 = lexer->lookahead;
      }
      if ((iVar5 != 10) && (_Var3 = (*lexer->eof)(lexer), !_Var3)) {
        return false;
      }
    }
    else {
      if (iVar5 == 0x23) {
        if (uVar6 == 0xffffffff) {
          uVar6 = uVar13;
        }
        iVar5 = 0x23;
        while ((iVar5 != 0 && (iVar5 != 10))) {
          (*lexer->advance)(lexer,true);
          iVar5 = lexer->lookahead;
        }
        goto LAB_001042d8;
      }
      if (iVar5 != 0x20) goto LAB_00104359;
      uVar13 = uVar13 + 1;
    }
LAB_001042db:
    (*lexer->advance)(lexer,true);
  } while( true );
LAB_00104592:
  iVar5 = lexer->lookahead;
  bVar8 = bVar11;
  if (iVar5 < 0x60) {
    if (iVar5 < 0x46) {
      if (iVar5 != 0x42) {
        if (iVar5 == 0x22) {
          (*lexer->advance)(lexer,false);
          (*lexer->mark_end)(lexer);
          bVar8 = bVar11 | 2;
          if ((lexer->lookahead == 0x22) &&
             ((*lexer->advance)(lexer,false), lexer->lookahead == 0x22)) {
            (*lexer->advance)(lexer,false);
            (*lexer->mark_end)(lexer);
            bVar8 = bVar11 | 0x22;
          }
        }
        else if (iVar5 == 0x27) {
          (*lexer->advance)(lexer,false);
          (*lexer->mark_end)(lexer);
          bVar8 = bVar11 | 1;
          if ((lexer->lookahead == 0x27) &&
             ((*lexer->advance)(lexer,false), lexer->lookahead == 0x27)) {
            (*lexer->advance)(lexer,false);
            (*lexer->mark_end)(lexer);
            bVar8 = bVar11 | 0x21;
          }
        }
LAB_00104741:
        if ((bVar8 & 7) == 0) {
          return false;
        }
        puVar9 = *(uint **)((long)payload + 8);
        uVar6 = *puVar9;
        pvVar7 = *(void **)(puVar9 + 2);
        if (puVar9[1] == uVar6) {
          uVar6 = puVar9[1] * 2;
          if (uVar6 < 0x11) {
            uVar6 = 0x10;
          }
          pvVar7 = realloc(pvVar7,(ulong)uVar6);
          if (pvVar7 == (void *)0x0) {
            __assert_fail("tmp != NULL",
                          "/workspace/llm4binary/github/license_c_cmakelists/PrestonKnopp[P]tree-sitter-gdscript/src/scanner.c"
                          ,0x1a5,
                          "_Bool tree_sitter_gdscript_external_scanner_scan(void *, TSLexer *, const _Bool *)"
                         );
          }
          puVar9 = *(uint **)((long)payload + 8);
          *(void **)(puVar9 + 2) = pvVar7;
          uVar6 = *puVar9;
          uVar13 = 0x10;
          if (0x10 < uVar6 * 2) {
            uVar13 = uVar6 * 2;
          }
          puVar9[1] = uVar13;
        }
        *puVar9 = uVar6 + 1;
        *(byte *)((long)pvVar7 + (ulong)uVar6) = bVar8;
        lexer->result_symbol = 3;
        return true;
      }
LAB_001045b9:
      bVar11 = bVar11 | 0x40;
    }
    else if (iVar5 == 0x46) {
LAB_001045e8:
      bVar11 = bVar11 | 0x10;
    }
    else {
      if (iVar5 == 0x52) goto LAB_001045e2;
      if (iVar5 != 0x55) goto LAB_00104741;
    }
  }
  else {
    if (iVar5 < 0x72) {
      if (iVar5 == 0x62) goto LAB_001045b9;
      if (iVar5 == 0x66) goto LAB_001045e8;
      if (iVar5 == 0x60) {
        (*lexer->advance)(lexer,false);
        (*lexer->mark_end)(lexer);
        bVar8 = bVar11 | 4;
      }
      goto LAB_00104741;
    }
    if (iVar5 == 0x72) {
LAB_001045e2:
      bVar11 = bVar11 | 8;
    }
    else if (iVar5 != 0x75) goto LAB_00104741;
  }
  (*lexer->advance)(lexer,false);
  goto LAB_00104592;
}

Assistant:

bool tree_sitter_gdscript_external_scanner_scan(void *payload, TSLexer *lexer,
                                                const bool *valid_symbols) {
    Scanner *scanner = (Scanner *)payload;

    bool error_recovery_mode =
        valid_symbols[STRING_CONTENT] && valid_symbols[INDENT];
    bool within_brackets = valid_symbols[CLOSE_BRACE] ||
                           valid_symbols[CLOSE_PAREN] ||
                           valid_symbols[CLOSE_BRACKET];

    if (valid_symbols[STRING_CONTENT] && scanner->delimiters->len > 0 &&
        !error_recovery_mode) {
        Delimiter delimiter = VEC_BACK(scanner->delimiters);
        int32_t end_char = end_character(&delimiter);
        bool has_content = false;
        while (lexer->lookahead) {
            if ((lexer->lookahead == '{' || lexer->lookahead == '}') &&
                is_format(&delimiter)) {
                lexer->mark_end(lexer);
                lexer->result_symbol = STRING_CONTENT;
                return has_content;
            }
            if (lexer->lookahead == '\\') {
                if (is_raw(&delimiter)) {
                    // Step over the backslash.
                    lexer->advance(lexer, false);
                    // Step over any escaped quotes.
                    if (lexer->lookahead == end_character(&delimiter) ||
                        lexer->lookahead == '\\') {
                        lexer->advance(lexer, false);
                    }
                    continue;
                }
                if (is_bytes(&delimiter)) {
                    lexer->mark_end(lexer);
                    lexer->advance(lexer, false);
                    if (lexer->lookahead == 'N' || lexer->lookahead == 'u' ||
                        lexer->lookahead == 'U') {
                        // In bytes string, \N{...}, \uXXXX and \UXXXXXXXX are
                        // not escape sequences
                        // https://docs.python.org/3/reference/lexical_analysis.html#string-and-bytes-literals
                        lexer->advance(lexer, false);
                    } else {
                        lexer->result_symbol = STRING_CONTENT;
                        return has_content;
                    }
                } else {
                    lexer->mark_end(lexer);
                    lexer->result_symbol = STRING_CONTENT;
                    return has_content;
                }
            } else if (lexer->lookahead == end_char) {
                if (is_triple(&delimiter)) {
                    lexer->mark_end(lexer);
                    lexer->advance(lexer, false);
                    if (lexer->lookahead == end_char) {
                        lexer->advance(lexer, false);
                        if (lexer->lookahead == end_char) {
                            if (has_content) {
                                lexer->result_symbol = STRING_CONTENT;
                            } else {
                                lexer->advance(lexer, false);
                                lexer->mark_end(lexer);
                                VEC_POP(scanner->delimiters);
                                lexer->result_symbol = STRING_END;
                            }
                            return true;
                        }
                        lexer->mark_end(lexer);
                        lexer->result_symbol = STRING_CONTENT;
                        return true;
                    }
                    lexer->mark_end(lexer);
                    lexer->result_symbol = STRING_CONTENT;
                    return true;
                }
                if (has_content) {
                    lexer->result_symbol = STRING_CONTENT;
                } else {
                    lexer->advance(lexer, false);
                    VEC_POP(scanner->delimiters);
                    lexer->result_symbol = STRING_END;
                }
                lexer->mark_end(lexer);
                return true;

            } else if (lexer->lookahead == '\n' && has_content &&
                       !is_triple(&delimiter)) {
                return false;
            }
            advance(lexer);
            has_content = true;
        }
    }

    lexer->mark_end(lexer);

    bool found_end_of_line = false;
    uint32_t indent_length = 0;
    int32_t first_comment_indent_length = -1;
    for (;;) {
        if (lexer->lookahead == '\n') {
            found_end_of_line = true;
            indent_length = 0;
            skip(lexer);
        } else if (lexer->lookahead == ' ') {
            indent_length++;
            skip(lexer);
        } else if (lexer->lookahead == '\r' || lexer->lookahead == '\f') {
            indent_length = 0;
            skip(lexer);
        } else if (lexer->lookahead == '\t') {
            indent_length += 8;
            skip(lexer);
        } else if (lexer->lookahead == '#') {
            if (first_comment_indent_length == -1) {
                first_comment_indent_length = (int32_t)indent_length;
            }
            while (lexer->lookahead && lexer->lookahead != '\n') {
                skip(lexer);
            }
            skip(lexer);
            indent_length = 0;
        } else if (lexer->lookahead == '\\') {
            skip(lexer);
            if (lexer->lookahead == '\r') {
                skip(lexer);
            }
            if (lexer->lookahead == '\n' || lexer->eof(lexer)) {
                skip(lexer);
            } else {
                return false;
            }
        } else if (lexer->eof(lexer)) {
            indent_length = 0;
            found_end_of_line = true;
            break;
        } else {
            break;
        }
    }

    if (found_end_of_line) {
        if (scanner->indents->len > 0) {
            uint16_t current_indent_length = VEC_BACK(scanner->indents);

            if (valid_symbols[INDENT] &&
                indent_length > current_indent_length) {
                VEC_PUSH(scanner->indents, indent_length);
                lexer->result_symbol = INDENT;
                return true;
            }

            if ((valid_symbols[DEDENT] ||
                 (!valid_symbols[NEWLINE] && !valid_symbols[STRING_START] &&
                  !within_brackets)) &&
                indent_length < current_indent_length &&

                // Wait to create a dedent token until we've consumed any
                // comments
                // whose indentation matches the current block.
                first_comment_indent_length < (int32_t)current_indent_length) {
                VEC_POP(scanner->indents);
                lexer->result_symbol = DEDENT;
                return true;
            }
        }

        if (valid_symbols[NEWLINE] && !error_recovery_mode) {
            lexer->result_symbol = NEWLINE;
            return true;
        }
    }

    // This if statement can be placed before the above if statement that
    // handles newlines. However, it feels safer to give indentation and
    // newlines higher precedence.
    if (
        // Guard against BODY_END tokens overriding valid tokens.
        !valid_symbols[COMMA] &&
        /* !valid_symbols[COLON] && */
        !valid_symbols[CLOSE_PAREN] && !valid_symbols[CLOSE_BRACE] &&
        !valid_symbols[CLOSE_BRACKET] &&

        // Body ends occur in error recovery mode since the grammar does not
        // (cannot?) specify that a body can end with the below characters
        // without consuming them itself.
        (error_recovery_mode || valid_symbols[BODY_END])) {
        if (lexer->lookahead == ',' || // separator
            lexer->lookahead == ')' || // args, params, paren expr
            lexer->lookahead == '}' || // dictionary (may not be needed)
            lexer->lookahead == ']'    // array
            /* lexer->lookahead == ':'     // key-value pairs (breaks if
               elses) */
        ) {
            // BODY_END tokens can take the place of a dedent. Therefore, we
            // should pop the stack when DEDENT is valid.
            if (valid_symbols[DEDENT] && scanner->indents->len > 0) {
                VEC_POP(scanner->indents);
            }
            lexer->result_symbol = BODY_END;
            return true;
        }
    }

    if (first_comment_indent_length == -1 && valid_symbols[STRING_START]) {
        Delimiter delimiter = new_delimiter();

        bool has_flags = false;
        while (lexer->lookahead) {
            if (lexer->lookahead == 'f' || lexer->lookahead == 'F') {
                set_format(&delimiter);
            } else if (lexer->lookahead == 'r' || lexer->lookahead == 'R') {
                set_raw(&delimiter);
            } else if (lexer->lookahead == 'b' || lexer->lookahead == 'B') {
                set_bytes(&delimiter);
            } else if (lexer->lookahead != 'u' && lexer->lookahead != 'U') {
                break;
            }
            has_flags = true;
            advance(lexer);
        }

        if (lexer->lookahead == '`') {
            set_end_character(&delimiter, '`');
            advance(lexer);
            lexer->mark_end(lexer);
        } else if (lexer->lookahead == '\'') {
            set_end_character(&delimiter, '\'');
            advance(lexer);
            lexer->mark_end(lexer);
            if (lexer->lookahead == '\'') {
                advance(lexer);
                if (lexer->lookahead == '\'') {
                    advance(lexer);
                    lexer->mark_end(lexer);
                    set_triple(&delimiter);
                }
            }
        } else if (lexer->lookahead == '"') {
            set_end_character(&delimiter, '"');
            advance(lexer);
            lexer->mark_end(lexer);
            if (lexer->lookahead == '"') {
                advance(lexer);
                if (lexer->lookahead == '"') {
                    advance(lexer);
                    lexer->mark_end(lexer);
                    set_triple(&delimiter);
                }
            }
        }

        if (end_character(&delimiter)) {
            VEC_PUSH(scanner->delimiters, delimiter);
            lexer->result_symbol = STRING_START;

            return true;
        }
        if (has_flags) {
            return false;
        }
    }

    return false;
}